

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O0

void __thiscall Am_Object_Data::convert_temporary_slot(Am_Object_Data *this,Am_Slot_Key key)

{
  long lVar1;
  Am_Slot_Data *slot;
  Am_Slot_Data **slot_array;
  uint i;
  Am_Slot_Key key_local;
  Am_Object_Data *this_local;
  
  slot_array._0_4_ = (this->data).length;
  slot = (Am_Slot_Data *)(this->data).data;
  do {
    if ((uint)slot_array == 0) {
      convert_temporaries(this,key);
      return;
    }
    lVar1 = *(long *)&slot->super_Am_Value;
    if (key == *(Am_Slot_Key *)(lVar1 + 0x30)) {
      if ((*(ushort *)(lVar1 + 0x38) & 2) == 0) {
        return;
      }
      *(ushort *)(lVar1 + 0x38) =
           *(ushort *)(lVar1 + 0x38) & 0xff00 | *(ushort *)(lVar1 + 0x38) & 0xfd;
      *(ushort *)(lVar1 + 0x38) = *(ushort *)(lVar1 + 0x38) & 0xfcff | 0x200;
    }
    slot_array._0_4_ = (uint)slot_array - 1;
    slot = (Am_Slot_Data *)&(slot->super_Am_Value).value;
  } while( true );
}

Assistant:

void
Am_Object_Data::convert_temporary_slot(Am_Slot_Key key)
{
  unsigned i;
  Am_Slot_Data **slot_array;
  Am_Slot_Data *slot;

  for (i = data.length, slot_array = (Am_Slot_Data **)data.data; i > 0;
       --i, ++slot_array) {
    slot = *slot_array;
    if (key == slot->key) {
      if (slot->flags & BIT_INHERITS) {
        slot->flags &= ~BIT_INHERITS;
        slot->rule = Am_COPY;
      } else
        return;
    }
  }
  convert_temporaries(key);
}